

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

uint32_t get_block_residue_hash(MACROBLOCK *x,BLOCK_SIZE bsize)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  uVar1 = (*av1_get_crc32c_value)
                    (&((x->txfm_search_info).mb_rd_record)->crc_calculator,
                     (uint8_t *)x->plane[0].src_diff,
                     (ulong)block_size_wide[uVar2] * (ulong)block_size_high[uVar2] * 2);
  return uVar1 * 0x20 + (int)CONCAT71(in_register_00000031,bsize);
}

Assistant:

static inline uint32_t get_block_residue_hash(MACROBLOCK *x, BLOCK_SIZE bsize) {
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];
  const int16_t *diff = x->plane[0].src_diff;
  const uint32_t hash =
      av1_get_crc32c_value(&x->txfm_search_info.mb_rd_record->crc_calculator,
                           (uint8_t *)diff, 2 * rows * cols);
  return (hash << 5) + bsize;
}